

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::ContentEncoding::ParseContentEncAESSettingsEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader,
          ContentEncAESSettings *aes)

{
  longlong *id_00;
  long lVar1;
  longlong lVar2;
  IMkvReader *in_RCX;
  long in_RDX;
  long in_RSI;
  longlong *in_R8;
  long status;
  longlong size_1;
  longlong id;
  longlong stop;
  longlong pos;
  long local_50;
  longlong *in_stack_ffffffffffffffb8;
  
  id_00 = (longlong *)(in_RSI + in_RDX);
  do {
    if ((long)id_00 <= in_RSI) {
      return 0;
    }
    lVar1 = ParseElementHeader(in_RCX,in_R8,in_RSI,id_00,in_stack_ffffffffffffffb8);
    if (lVar1 < 0) {
      return lVar1;
    }
    if (in_stack_ffffffffffffffb8 == (longlong *)0x47e8) {
      lVar2 = UnserializeUInt(in_RCX,(longlong)in_R8,in_RSI);
      *in_R8 = lVar2;
      if (*in_R8 != 1) {
        return -2;
      }
    }
    in_RSI = local_50 + in_RSI;
  } while (in_RSI <= (long)id_00);
  return -2;
}

Assistant:

long ContentEncoding::ParseContentEncAESSettingsEntry(
    long long start, long long size, IMkvReader* pReader,
    ContentEncAESSettings* aes) {
  assert(pReader);
  assert(aes);

  long long pos = start;
  const long long stop = start + size;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvAESSettingsCipherMode) {
      aes->cipher_mode = UnserializeUInt(pReader, pos, size);
      if (aes->cipher_mode != 1)
        return E_FILE_FORMAT_INVALID;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  return 0;
}